

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O2

void __thiscall
Refal2::CGlobalFunctionData::SetPreparatoryFunction
          (CGlobalFunctionData *this,CPreparatoryFunction *_preparatoryFunction,
          TRuntimeModuleId _runtimeModuleId)

{
  uint __line;
  char *__assertion;
  
  if (this->preparatoryFunction == (CPreparatoryFunction *)0x0 &&
      this->embeddedFunction == (TEmbeddedFunctionPtr)0x0) {
    if (_preparatoryFunction != (CPreparatoryFunction *)0x0) {
      this->preparatoryFunction = _preparatoryFunction;
      this->runtimeModuleId = _runtimeModuleId;
      return;
    }
    __assertion = "_preparatoryFunction != nullptr";
    __line = 0x67;
  }
  else {
    __assertion = "!IsDefined()";
    __line = 0x66;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                ,__line,
                "void Refal2::CGlobalFunctionData::SetPreparatoryFunction(const CPreparatoryFunction *const, const TRuntimeModuleId)"
               );
}

Assistant:

void CGlobalFunctionData::SetPreparatoryFunction(
	const CPreparatoryFunction* const _preparatoryFunction,
	const TRuntimeModuleId _runtimeModuleId )
{
	assert( !IsDefined() );
	assert( _preparatoryFunction != nullptr );
	preparatoryFunction = _preparatoryFunction;
	runtimeModuleId = _runtimeModuleId;
}